

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

void __thiscall Js::CompoundString::Grow(CompoundString *this)

{
  Type *addr;
  Type *this_00;
  Block *pBVar1;
  code *pcVar2;
  Type TVar3;
  bool bVar4;
  char16 *pcVar5;
  undefined4 *puVar6;
  Block *pBVar7;
  
  pcVar5 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar5 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3b1,"(!IsFinalized())","!IsFinalized()");
    if (!bVar4) goto LAB_00b2a556;
    *puVar6 = 0;
  }
  if (this->ownsLastBlock == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x3b2,"(OwnsLastBlock())","OwnsLastBlock()");
    if (!bVar4) {
LAB_00b2a556:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  addr = &this->lastBlock;
  pBVar7 = (this->lastBlock).ptr;
  this_00 = &this->lastBlockInfo;
  if (pBVar7 == (Block *)0x0) {
    pBVar7 = BlockInfo::Resize(this_00,((((this->super_LiteralString).super_JavascriptString.
                                          super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
                                       ->recycler);
  }
  else {
    BlockInfo::CopyTo(this_00,pBVar7);
    pBVar7 = Block::Chain(pBVar7,((((this->super_LiteralString).super_JavascriptString.
                                    super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                                 recycler);
    pBVar1 = (pBVar7->bufferOwner).ptr;
    Memory::Recycler::WBSetBit((char *)this_00);
    (this->lastBlockInfo).buffer.ptr = pBVar1 + 1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this_00);
    TVar3 = pBVar7->charCapacity;
    (this->lastBlockInfo).charLength = pBVar7->charLength;
    (this->lastBlockInfo).charCapacity = TVar3;
  }
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pBVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void CompoundString::Grow()
    {
        Assert(!IsFinalized());
        Assert(OwnsLastBlock());

        Block *const lastBlock = this->lastBlock;
        if(!lastBlock)
        {
            // There is no last block. Only the buffer was allocated, and is held in 'lastBlockInfo'. In that case it is always
            // within the threshold to resize. Resize the buffer or resize it into a new block depending on its size.
            this->lastBlock = lastBlockInfo.Resize(GetLibrary()->GetRecycler());
            return;
        }

        lastBlockInfo.CopyTo(lastBlock);
        Block *const newLastBlock = lastBlock->Chain(GetLibrary()->GetRecycler());
        lastBlockInfo.CopyFrom(newLastBlock);
        this->lastBlock = newLastBlock;
    }